

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O3

bool __thiscall
QNativeSocketEngine::leaveMulticastGroup
          (QNativeSocketEngine *this,QHostAddress *groupAddress,QNetworkInterface *iface)

{
  QNativeSocketEnginePrivate *this_00;
  char cVar1;
  bool bVar2;
  
  this_00 = *(QNativeSocketEnginePrivate **)(this + 8);
  cVar1 = (**(code **)(*(long *)this + 0x78))();
  if (cVar1 == '\0') {
    leaveMulticastGroup();
  }
  else if ((this_00->super_QAbstractSocketEnginePrivate).socketState == BoundState) {
    if ((this_00->super_QAbstractSocketEnginePrivate).socketType == UdpSocket) {
      bVar2 = QNativeSocketEnginePrivate::nativeLeaveMulticastGroup(this_00,groupAddress,iface);
      return bVar2;
    }
    leaveMulticastGroup();
  }
  else {
    leaveMulticastGroup();
  }
  return false;
}

Assistant:

bool QNativeSocketEngine::leaveMulticastGroup(const QHostAddress &groupAddress,
                                              const QNetworkInterface &iface)
{
    Q_D(QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::leaveMulticastGroup(), false);
    Q_CHECK_STATE(QNativeSocketEngine::leaveMulticastGroup(), QAbstractSocket::BoundState, false);
    Q_CHECK_TYPE(QNativeSocketEngine::leaveMulticastGroup(), QAbstractSocket::UdpSocket, false);
    return d->nativeLeaveMulticastGroup(groupAddress, iface);
}